

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O2

void test_insert_delete_gives_null(CuTest *tc)

{
  int iVar1;
  selist *ql;
  
  ql = (selist *)0x0;
  iVar1 = selist_empty((selist *)0x0);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x85,(char *)0x0,1,iVar1);
  selist_push(&ql,
              "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  iVar1 = selist_empty(ql);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x87,(char *)0x0,0,iVar1);
  selist_delete(&ql,0);
  CuAssertPtrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x89,(char *)0x0,(void *)0x0,ql);
  selist_free(ql);
  return;
}

Assistant:

static void test_insert_delete_gives_null(CuTest * tc)
{
    struct selist *ql = NULL;
    CuAssertIntEquals(tc, 1, selist_empty(ql));
    selist_push(&ql, (void *)lipsum);
    CuAssertIntEquals(tc, 0, selist_empty(ql));
    selist_delete(&ql, 0);
    CuAssertPtrEquals(tc, NULL, ql);
    selist_free(ql);
}